

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

QList<QTableWidgetItem_*> * __thiscall QTableModel::columnItems(QTableModel *this,int column)

{
  int row_00;
  QTableWidgetItem *pQVar1;
  undefined4 in_EDX;
  long *in_RSI;
  QList<QTableWidgetItem_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  QTableWidgetItem *itm;
  int row;
  int rc;
  QList<QTableWidgetItem_*> *items;
  parameter_type in_stack_ffffffffffffff98;
  int column_00;
  uint3 in_stack_ffffffffffffffc8;
  uint uVar2;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (uint)in_stack_ffffffffffffffc8;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTableWidgetItem_*>::QList((QList<QTableWidgetItem_*> *)0x8d4dd5);
  QModelIndex::QModelIndex((QModelIndex *)0x8d4ddf);
  row_00 = (**(code **)(*in_RSI + 0x78))(in_RSI,local_20);
  QList<QTableWidgetItem_*>::reserve
            ((QList<QTableWidgetItem_*> *)CONCAT44(in_EDX,uVar2),in_stack_00000008);
  column_00 = 0;
  while ((column_00 < row_00 &&
         (pQVar1 = item((QTableModel *)CONCAT44(in_EDX,uVar2),row_00,column_00),
         pQVar1 != (QTableWidgetItem *)0x0))) {
    QList<QTableWidgetItem_*>::append
              ((QList<QTableWidgetItem_*> *)0x8d4e44,in_stack_ffffffffffffff98);
    column_00 = column_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<QTableWidgetItem *> QTableModel::columnItems(int column) const
{
    QList<QTableWidgetItem *> items;
    int rc = rowCount();
    items.reserve(rc);
    for (int row = 0; row < rc; ++row) {
        QTableWidgetItem *itm = item(row, column);
        if (itm == nullptr) {
            // no more sortable items (all 0-items are
            // at the end of the table when it is sorted)
            break;
        }
        items.append(itm);
    }
    return items;
}